

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNOT.cpp
# Opt level: O1

void test_qclab_qgates_CNOT<std::complex<double>>(void)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  double *pdVar8;
  bool bVar9;
  pointer *__ptr_16;
  long lVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  double *pdVar14;
  pointer *__ptr_1;
  long lVar15;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  vector<int,_std::allocator<int>_> qubits;
  AssertionResult gtest_ar__5;
  CNOT<std::complex<double>_> cnot2;
  CNOT<std::complex<double>_> cnot;
  stringstream qasm;
  PauliX<std::complex<double>_> X;
  undefined1 local_250 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  AssertHelper local_230;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  pointer local_218;
  Message local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  AssertHelper local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  long *local_1f0;
  CX<std::complex<double>_> local_1e8;
  AssertHelper local_1d0;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [7];
  ios_base local_148 [264];
  AssertHelper local_40;
  undefined4 local_38;
  
  local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 0;
  local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 1;
  local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
  local_1e8.gate_._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
        )operator_new(0x10);
  (((PauliX<std::complex<double>_> *)
   local_1e8.gate_._M_t.
   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)->
  super_QGate1<std::complex<double>_>).qubit_ = 1;
  (((PauliX<std::complex<double>_> *)
   local_1e8.gate_._M_t.
   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)->
  super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0051fe50;
  local_250._0_4_ = 2;
  local_228._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.nbQubits()","2",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
  local_228._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.control()","0",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x10,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  iVar5 = (*(((QGate1<std::complex<double>_> *)
             local_1e8.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  local_250._0_4_ = iVar5;
  local_228._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.target()","1",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x11,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
  local_228._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.controlState()","1",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x12,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  pdVar7 = (double *)operator_new__(0x100);
  memset(pdVar7,0,0x100);
  *pdVar7 = 1.0;
  pdVar7[1] = 0.0;
  pdVar7[2] = 0.0;
  pdVar7[3] = 0.0;
  pdVar7[4] = 0.0;
  pdVar7[5] = 0.0;
  pdVar7[6] = 0.0;
  pdVar7[7] = 0.0;
  pdVar7[8] = 0.0;
  pdVar7[9] = 0.0;
  pdVar7[10] = 1.0;
  pdVar7[0xb] = 0.0;
  pdVar7[0xc] = 0.0;
  pdVar7[0xd] = 0.0;
  pdVar7[0xe] = 0.0;
  pdVar7[0xf] = 0.0;
  pdVar7[0x10] = 0.0;
  pdVar7[0x11] = 0.0;
  pdVar7[0x12] = 0.0;
  pdVar7[0x13] = 0.0;
  pdVar7[0x14] = 0.0;
  pdVar7[0x15] = 0.0;
  pdVar7[0x16] = 1.0;
  pdVar7[0x17] = 0.0;
  pdVar7[0x18] = 0.0;
  pdVar7[0x19] = 0.0;
  pdVar7[0x1a] = 0.0;
  pdVar7[0x1b] = 0.0;
  pdVar7[0x1c] = 1.0;
  pdVar7[0x1f] = 0.0;
  pdVar7[0x1d] = 0.0;
  pdVar7[0x1e] = 0.0;
  qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
            ((QControlledGate2<std::complex<double>_> *)local_1c8);
  if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
    bVar9 = false;
    if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
       (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
      if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
         (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
        lVar10 = 0;
        bVar9 = false;
        in_R9 = local_1c0;
        pdVar8 = pdVar7;
        do {
          lVar13 = 0x18;
          lVar15 = 0;
          while( true ) {
            if (lVar15 == 3) goto LAB_0035b964;
            dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
            lVar15 = lVar15 + 1;
            pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
            if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
            pdVar14 = (double *)((long)pdVar8 + lVar13);
            pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
            lVar13 = lVar13 + 0x10;
            if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
          }
          if (lVar15 < 4) break;
LAB_0035b964:
          lVar10 = lVar10 + 1;
          bVar9 = 3 < lVar10;
          if (lVar10 == 4) break;
          if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
             (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
          break;
          pdVar8 = pdVar8 + 8;
          in_R9 = in_R9 + 2;
          if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
             (NAN(pdVar7[lVar10 * 8 + 1]) || NAN((double)local_1c0[lVar10 * 2]._M_string_length)))
          break;
        } while( true );
      }
    }
  }
  else {
    bVar9 = false;
  }
  local_250[0] = (internal)bVar9;
  local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_250,
               (AssertionResult *)"cnot.matrix() == CNOT_check","false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x19,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  iVar6 = (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x18))();
  iVar5 = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
  if (iVar6 < local_1e8.super_QControlledGate2<std::complex<double>_>.control_) {
    iVar5 = iVar6;
  }
  local_250._0_4_ = iVar5;
  local_228._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.qubit()","0",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x1c,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  qclab::qgates::QControlledGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)local_228,
             &local_1e8.super_QControlledGate2<std::complex<double>_>);
  local_250 = (undefined1  [8])((long)local_220 - CONCAT44(local_228._4_4_,local_228._0_4_) >> 2);
  local_200.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1c8,"qubits.size()","2",(unsigned_long *)local_250,(int *)&local_200)
  ;
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x20,pcVar11);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250 = (undefined1  [8])((ulong)local_250 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"qubits[0]","0",(int *)CONCAT44(local_228._4_4_,local_228._0_4_),
             (int *)local_250);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x21,pcVar11);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"qubits[1]","1",
             (int *)(CONCAT44(local_228._4_4_,local_228._0_4_) + 4),(int *)local_250);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x22,pcVar11);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 5;
  (**(_func_int **)
     ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject +
     0x88))(&local_1e8,3);
  qclab::qgates::QControlledGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)local_1c8,
             &local_1e8.super_QControlledGate2<std::complex<double>_>);
  local_200.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.qubits()[0]","3",
             (int *)CONCAT71(local_1c8._1_7_,local_1c8[0]),(int *)&local_200);
  pvVar4 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,local_1b8[0]._M_allocated_capacity - (long)pvVar4);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x25,pcVar11);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  qclab::qgates::QControlledGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)local_1c8,
             &local_1e8.super_QControlledGate2<std::complex<double>_>);
  local_200.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.qubits()[1]","5",
             (int *)(CONCAT71(local_1c8._1_7_,local_1c8[0]) + 4),(int *)&local_200);
  pvVar4 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,local_1b8[0]._M_allocated_capacity - (long)pvVar4);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x26,pcVar11);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  local_1e8.super_QControlledGate2<std::complex<double>_>._8_8_ =
       local_1e8.super_QControlledGate2<std::complex<double>_>._8_8_ & 0xffffffff00000000;
  (**(_func_int **)
     ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject +
     0x88))(&local_1e8,1);
  qclab::qgates::QGate2<std::complex<double>_>::print((QGate2<std::complex<double>_> *)&local_1e8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  iVar5 = qclab::qgates::CX<std::complex<double>_>::toQASM
                    (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
  local_200.data_._0_4_ = iVar5;
  local_40.data_ = (AssertHelperData *)((ulong)local_40.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.toQASM( qasm )","0",(int *)&local_200,(int *)&local_40);
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x30,pcVar11);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_200.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200.data_ + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&local_200,"qasm.str()","\"cx q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
             (char (*) [16])"cx q[0], q[1];\n");
  if (local_250 != (undefined1  [8])&local_240) {
    operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
  }
  if (local_200.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_1f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x31,pcVar11);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_250 + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_250,(long)local_248);
  if (local_250 != (undefined1  [8])&local_240) {
    operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
  }
  local_38 = 0;
  local_40.data_ = (AssertHelperData *)&PTR_nbQubits_0051fe50;
  iVar5 = (*(((QGate1<std::complex<double>_> *)
             local_1e8.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[0xe])();
  local_200.data_._0_1_ = (internal)(char)iVar5;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar5 == '\0') {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,(AssertionResult *)"*cnot.gate() == X",
               "false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x36,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  (**(code **)(*(long *)local_1e8.gate_._M_t.
                        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                        .
                        super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                        ._M_head_impl + 0x38))(local_250);
  pdVar8 = (double *)operator_new__(0x40);
  pdVar8[2] = 0.0;
  pdVar8[3] = 0.0;
  pdVar8[4] = 0.0;
  pdVar8[5] = 0.0;
  pdVar8[6] = 0.0;
  pdVar8[7] = 0.0;
  *pdVar8 = 0.0;
  pdVar8[1] = 0.0;
  pdVar8[2] = 1.0;
  pdVar8[3] = 0.0;
  pdVar8[4] = 1.0;
  pdVar8[5] = 0.0;
  pdVar8[6] = 0.0;
  pdVar8[7] = 0.0;
  bVar9 = false;
  if (local_250 == (undefined1  [8])0x2) {
    bVar9 = false;
    if ((*pdVar8 == (double)(local_248->_M_dataplus)._M_p) &&
       (!NAN(*pdVar8) && !NAN((double)(local_248->_M_dataplus)._M_p))) {
      bVar9 = false;
      if ((pdVar8[1] == (double)local_248->_M_string_length) &&
         (!NAN(pdVar8[1]) && !NAN((double)local_248->_M_string_length))) {
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar9 = false;
        pbVar12 = local_248;
        pdVar14 = pdVar8;
        do {
          lVar10 = 0x18;
          lVar13 = 0;
          while( true ) {
            if (lVar13 == 1) goto LAB_0035c363;
            dVar3 = *(double *)((long)pdVar14 + lVar10 + -8);
            lVar13 = lVar13 + 1;
            pdVar2 = (double *)((long)pbVar12 + lVar10 + -8);
            if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) break;
            pdVar2 = (double *)((long)pdVar14 + lVar10);
            pdVar1 = (double *)((long)&(pbVar12->_M_dataplus)._M_p + lVar10);
            lVar10 = lVar10 + 0x10;
            if ((*pdVar2 != *pdVar1) || (NAN(*pdVar2) || NAN(*pdVar1))) break;
          }
          if (lVar13 < 2) break;
LAB_0035c363:
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(in_R9->_M_dataplus)._M_p + 1);
          bVar9 = 1 < (long)in_R9;
          if (in_R9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2)
          break;
          if ((pdVar8[(long)in_R9 * 4] != (double)local_248[(long)in_R9]._M_dataplus._M_p) ||
             (NAN(pdVar8[(long)in_R9 * 4]) || NAN((double)local_248[(long)in_R9]._M_dataplus._M_p)))
          break;
          pdVar14 = pdVar14 + 4;
          pbVar12 = pbVar12 + 1;
          if ((pdVar8[(long)in_R9 * 4 + 1] != (double)local_248[(long)in_R9]._M_string_length) ||
             (NAN(pdVar8[(long)in_R9 * 4 + 1]) ||
              NAN((double)local_248[(long)in_R9]._M_string_length))) break;
        } while( true );
      }
    }
  }
  local_200.data_._0_1_ = (internal)bVar9;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  operator_delete__(pdVar8);
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_248);
  }
  if (local_200.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,
               (AssertionResult *)"cnot.gate()->matrix() == X.matrix()","false","true",(char *)in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x37,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  iVar5 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 0x70))(&local_1e8,&local_40);
  local_200.data_ = (AssertHelperData *)(CONCAT71(local_200.data_._1_7_,(char)iVar5) ^ 1);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar5 != '\0') {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,(AssertionResult *)"cnot != X","false",
               "true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3a,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  iVar5 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 0x70))(&local_1e8,&local_40);
  local_200.data_ = (AssertHelperData *)(CONCAT71(local_200.data_._1_7_,(char)iVar5) ^ 1);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar5 != '\0') {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,(AssertionResult *)"cnot == X","true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3b,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  local_200.data_ = (AssertHelperData *)&PTR_nbQubits_00520170;
  local_1f0 = (long *)operator_new(0x10);
  *(undefined4 *)(local_1f0 + 1) = 1;
  *local_1f0 = (long)&PTR_nbQubits_0051fe50;
  iVar5 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 0x70))();
  local_210.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_210.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,(char)iVar5);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar5 == '\0') {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2","false"
               ,"true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3d,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  iVar5 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 0x70))(&local_1e8,&local_200);
  local_210.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_210.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,(char)iVar5);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar5 == '\0') {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2","true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3e,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  iVar5 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 0x78))();
  if (iVar5 == 3) {
LAB_003603e0:
    __assert_fail("control != target()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x85,
                  "void qclab::qgates::QControlledGate2<std::complex<double>>::setControl(const int) [T = std::complex<double>]"
                 );
  }
  local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 3;
  local_210.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  local_230.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.control()","3",(int *)&local_210,(int *)&local_230);
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message(&local_210);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x42,pcVar11);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  if (local_1e8.super_QControlledGate2<std::complex<double>_>.control_ != 5) {
    (*(((QGate1<std::complex<double>_> *)
       local_1e8.gate_._M_t.
       super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
       .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)->
      super_QObject<std::complex<double>_>)._vptr_QObject[4])
              (local_1e8.gate_._M_t.
               super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
               .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
               _M_head_impl,5);
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         (**(code **)(*(long *)local_1e8.gate_._M_t.
                               super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                               .
                               super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                               ._M_head_impl + 0x18))();
    local_230.data_._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_250,"cnot.target()","5",(int *)&local_210,(int *)&local_230);
    if (local_250[0] == (internal)0x0) {
      testing::Message::Message(&local_210);
      if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (local_248->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x44,pcVar11);
      testing::internal::AssertHelper::operator=(&local_230,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      if ((long *)CONCAT44(local_210.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (uint)local_210.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (uint)local_210.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl) + 8))();
      }
    }
    if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_248,local_248);
    }
    iVar5 = (**(_func_int **)
               ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                      super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                      _vptr_QObject + 0x70))(&local_1e8,&local_200);
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_210.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,(char)iVar5);
    local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char)iVar5 == '\0') {
      testing::Message::Message((Message *)&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                 "false","true",(char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x45,(char *)local_250);
      testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      if (local_250 != (undefined1  [8])&local_240) {
        operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
      }
    }
    if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,local_208);
    }
    iVar5 = (**(_func_int **)
               ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                      super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                      _vptr_QObject + 0x70))(&local_1e8,&local_200);
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_210.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,(char)iVar5);
    local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char)iVar5 == '\0') {
      testing::Message::Message((Message *)&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                 "true","false",(char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x46,(char *)local_250);
      testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      if (local_250 != (undefined1  [8])&local_240) {
        operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
      }
    }
    if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,local_208);
    }
    iVar5 = (**(_func_int **)
               ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                      super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                      _vptr_QObject + 0x78))();
    if (iVar5 == 4) goto LAB_003603e0;
    local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 4;
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 4;
    local_230.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_250,"cnot.control()","4",(int *)&local_210,(int *)&local_230);
    if (local_250[0] == (internal)0x0) {
      testing::Message::Message(&local_210);
      if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (local_248->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x49,pcVar11);
      testing::internal::AssertHelper::operator=(&local_230,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      if ((long *)CONCAT44(local_210.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (uint)local_210.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (uint)local_210.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl) + 8))();
      }
    }
    if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_248,local_248);
    }
    if (local_1e8.super_QControlledGate2<std::complex<double>_>.control_ != 1) {
      (*(((QGate1<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QObject<std::complex<double>_>)._vptr_QObject[4])
                (local_1e8.gate_._M_t.
                 super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                 .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                 _M_head_impl,1);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           (**(code **)(*(long *)local_1e8.gate_._M_t.
                                 super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                 .
                                 super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                 ._M_head_impl + 0x18))();
      local_230.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.target()","1",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x4b,pcVar11);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      iVar5 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                        super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar5) ^ 1;
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar5 != '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                   "false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x4c,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      iVar5 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                        super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar5) ^ 1;
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar5 != '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                   "true","false",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x4d,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      *(undefined8 *)CONCAT44(local_228._4_4_,local_228._0_4_) = 0x200000001;
      local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 1;
      (**(_func_int **)
         ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                _vptr_QObject + 0x88))
                (&local_1e8,(ulong)*(uint *)((long)CONCAT44(local_228._4_4_,local_228._0_4_) + 4));
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
      local_230.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.control()","1",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x52,pcVar11);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           (*(((QGate1<std::complex<double>_> *)
              local_1e8.gate_._M_t.
              super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
              .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
              _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
      local_230.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.target()","2",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x53,pcVar11);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      iVar5 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                        super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar5);
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar5 == '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                   "false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x54,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      iVar5 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                        super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar5);
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar5 == '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                   "true","false",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x55,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      iVar5 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                        super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                        _vptr_QObject + 0x78))();
      if (iVar5 == 0) goto LAB_003603e0;
      local_1e8.super_QControlledGate2<std::complex<double>_>._8_8_ =
           local_1e8.super_QControlledGate2<std::complex<double>_>._8_8_ & 0xffffffff00000000;
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      local_230.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.control()","0",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x58,pcVar11);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      if (local_1e8.super_QControlledGate2<std::complex<double>_>.control_ != 1) {
        (*(((QGate1<std::complex<double>_> *)
           local_1e8.gate_._M_t.
           super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
           _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[4])
                  (local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl,1);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (**(code **)(*(long *)local_1e8.gate_._M_t.
                                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                   .
                                   super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                   ._M_head_impl + 0x18))();
        local_230.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot.target()","1",(int *)&local_210,(int *)&local_230);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message(&local_210);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5a,pcVar11);
          testing::internal::AssertHelper::operator=(&local_230,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          if ((long *)CONCAT44(local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (uint)local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (uint)local_210.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>._8_8_ =
             local_1e8.super_QControlledGate2<std::complex<double>_>._8_8_ & 0xffffffff;
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        local_230.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot.controlState()","0",(int *)&local_210,
                   (int *)&local_230);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message(&local_210);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5c,pcVar11);
          testing::internal::AssertHelper::operator=(&local_230,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          if ((long *)CONCAT44(local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (uint)local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (uint)local_210.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        iVar5 = (**(_func_int **)
                   ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                          super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                          _vptr_QObject + 0x70))(&local_1e8,&local_200);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_210.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,(char)iVar5) ^ 1;
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((char)iVar5 != '\0') {
          testing::Message::Message((Message *)&local_230);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                     "false","true",(char *)in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5d,(char *)local_250);
          testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          if (local_250 != (undefined1  [8])&local_240) {
            operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
          }
        }
        if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_208,local_208);
        }
        iVar5 = (**(_func_int **)
                   ((long)local_1e8.super_QControlledGate2<std::complex<double>_>.
                          super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                          _vptr_QObject + 0x70))(&local_1e8,&local_200);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_210.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,(char)iVar5) ^ 1;
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((char)iVar5 != '\0') {
          testing::Message::Message((Message *)&local_230);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                     "true","false",(char *)in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5e,(char *)local_250);
          testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          if (local_250 != (undefined1  [8])&local_240) {
            operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
          }
        }
        if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_208,local_208);
        }
        local_200.data_ = (AssertHelperData *)&PTR_nbQubits_00520170;
        if (local_1f0 != (long *)0x0) {
          (**(code **)(*local_1f0 + 0x68))();
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        pvVar4 = (void *)CONCAT44(local_228._4_4_,local_228._0_4_);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)local_218 - (long)pvVar4);
        }
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (*(((QGate1<std::complex<double>_> *)
             local_1e8.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[0xd])();
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 0;
        local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).qubit_ = 1;
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051fe50;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,100,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.control()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x67,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar5 = (*(((QGate1<std::complex<double>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar5;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.target()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x68,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x69,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pdVar7 = (double *)operator_new__(0x100);
        memset(pdVar7,0,0x100);
        *pdVar7 = 1.0;
        pdVar7[1] = 0.0;
        pdVar7[2] = 0.0;
        pdVar7[3] = 0.0;
        pdVar7[4] = 0.0;
        pdVar7[5] = 0.0;
        pdVar7[6] = 0.0;
        pdVar7[7] = 0.0;
        pdVar7[8] = 0.0;
        pdVar7[9] = 0.0;
        pdVar7[10] = 1.0;
        pdVar7[0xb] = 0.0;
        pdVar7[0xc] = 0.0;
        pdVar7[0xd] = 0.0;
        pdVar7[0xe] = 0.0;
        pdVar7[0xf] = 0.0;
        pdVar7[0x10] = 0.0;
        pdVar7[0x11] = 0.0;
        pdVar7[0x12] = 0.0;
        pdVar7[0x13] = 0.0;
        pdVar7[0x14] = 0.0;
        pdVar7[0x15] = 0.0;
        pdVar7[0x16] = 1.0;
        pdVar7[0x17] = 0.0;
        pdVar7[0x18] = 0.0;
        pdVar7[0x19] = 0.0;
        pdVar7[0x1a] = 0.0;
        pdVar7[0x1b] = 0.0;
        pdVar7[0x1c] = 1.0;
        pdVar7[0x1f] = 0.0;
        pdVar7[0x1d] = 0.0;
        pdVar7[0x1e] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
                  ((QControlledGate2<std::complex<double>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar9 = false;
          if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
            if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
               (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
              lVar10 = 0;
              bVar9 = false;
              in_R9 = local_1c0;
              pdVar8 = pdVar7;
              do {
                lVar13 = 0x18;
                lVar15 = 0;
                while( true ) {
                  if (lVar15 == 3) goto LAB_0035dad4;
                  dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
                  lVar15 = lVar15 + 1;
                  pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
                  if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
                  pdVar14 = (double *)((long)pdVar8 + lVar13);
                  pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
                  lVar13 = lVar13 + 0x10;
                  if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
                }
                if (lVar15 < 4) break;
LAB_0035dad4:
                lVar10 = lVar10 + 1;
                bVar9 = 3 < lVar10;
                if (lVar10 == 4) break;
                if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
                   (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
                break;
                pdVar8 = pdVar8 + 8;
                in_R9 = in_R9 + 2;
                if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
                   (NAN(pdVar7[lVar10 * 8 + 1]) ||
                    NAN((double)local_1c0[lVar10 * 2]._M_string_length))) break;
              } while( true );
            }
          }
        }
        else {
          bVar9 = false;
        }
        local_250[0] = (internal)bVar9;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot01.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x70,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<double>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot01.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x74,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[0], q[1];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[0], q[1];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x75,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 3;
        local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).qubit_ = 5;
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051fe50;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x7b,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
        local_228._0_4_ = 3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.control()","3",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x7e,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar5 = (*(((QGate1<std::complex<double>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar5;
        local_228._0_4_ = 5;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.target()","5",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x7f,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x80,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pdVar7 = (double *)operator_new__(0x100);
        memset(pdVar7,0,0x100);
        *pdVar7 = 1.0;
        pdVar7[1] = 0.0;
        pdVar7[2] = 0.0;
        pdVar7[3] = 0.0;
        pdVar7[4] = 0.0;
        pdVar7[5] = 0.0;
        pdVar7[6] = 0.0;
        pdVar7[7] = 0.0;
        pdVar7[8] = 0.0;
        pdVar7[9] = 0.0;
        pdVar7[10] = 1.0;
        pdVar7[0xb] = 0.0;
        pdVar7[0xc] = 0.0;
        pdVar7[0xd] = 0.0;
        pdVar7[0xe] = 0.0;
        pdVar7[0xf] = 0.0;
        pdVar7[0x10] = 0.0;
        pdVar7[0x11] = 0.0;
        pdVar7[0x12] = 0.0;
        pdVar7[0x13] = 0.0;
        pdVar7[0x14] = 0.0;
        pdVar7[0x15] = 0.0;
        pdVar7[0x16] = 1.0;
        pdVar7[0x17] = 0.0;
        pdVar7[0x18] = 0.0;
        pdVar7[0x19] = 0.0;
        pdVar7[0x1a] = 0.0;
        pdVar7[0x1b] = 0.0;
        pdVar7[0x1c] = 1.0;
        pdVar7[0x1f] = 0.0;
        pdVar7[0x1d] = 0.0;
        pdVar7[0x1e] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
                  ((QControlledGate2<std::complex<double>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar9 = false;
          if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
            if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
               (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
              lVar10 = 0;
              bVar9 = false;
              in_R9 = local_1c0;
              pdVar8 = pdVar7;
              do {
                lVar13 = 0x18;
                lVar15 = 0;
                while( true ) {
                  if (lVar15 == 3) goto LAB_0035e26e;
                  dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
                  lVar15 = lVar15 + 1;
                  pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
                  if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
                  pdVar14 = (double *)((long)pdVar8 + lVar13);
                  pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
                  lVar13 = lVar13 + 0x10;
                  if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
                }
                if (lVar15 < 4) break;
LAB_0035e26e:
                lVar10 = lVar10 + 1;
                bVar9 = 3 < lVar10;
                if (lVar10 == 4) break;
                if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
                   (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
                break;
                pdVar8 = pdVar8 + 8;
                in_R9 = in_R9 + 2;
                if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
                   (NAN(pdVar7[lVar10 * 8 + 1]) ||
                    NAN((double)local_1c0[lVar10 * 2]._M_string_length))) break;
              } while( true );
            }
          }
        }
        else {
          bVar9 = false;
        }
        local_250[0] = (internal)bVar9;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot35.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x87,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<double>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot35.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x8b,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[3], q[5];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[3], q[5];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x8c,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 1;
        local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).qubit_ = 0;
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051fe50;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x92,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.control()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x95,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar5 = (*(((QGate1<std::complex<double>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar5;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.target()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x96,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x97,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pdVar7 = (double *)operator_new__(0x100);
        memset(pdVar7,0,0x100);
        *pdVar7 = 1.0;
        pdVar7[1] = 0.0;
        pdVar7[2] = 0.0;
        pdVar7[3] = 0.0;
        pdVar7[4] = 0.0;
        pdVar7[5] = 0.0;
        pdVar7[6] = 0.0;
        pdVar7[7] = 0.0;
        pdVar7[8] = 0.0;
        pdVar7[9] = 0.0;
        pdVar7[10] = 0.0;
        pdVar7[0xb] = 0.0;
        pdVar7[0xc] = 0.0;
        pdVar7[0xd] = 0.0;
        pdVar7[0xe] = 1.0;
        pdVar7[0xf] = 0.0;
        pdVar7[0x10] = 0.0;
        pdVar7[0x11] = 0.0;
        pdVar7[0x12] = 0.0;
        pdVar7[0x13] = 0.0;
        pdVar7[0x14] = 1.0;
        pdVar7[0x15] = 0.0;
        pdVar7[0x16] = 0.0;
        pdVar7[0x17] = 0.0;
        pdVar7[0x18] = 0.0;
        pdVar7[0x19] = 0.0;
        pdVar7[0x1a] = 1.0;
        pdVar7[0x1f] = 0.0;
        pdVar7[0x1d] = 0.0;
        pdVar7[0x1e] = 0.0;
        pdVar7[0x1b] = 0.0;
        pdVar7[0x1c] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
                  ((QControlledGate2<std::complex<double>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar9 = false;
          if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
            if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
               (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
              lVar10 = 0;
              bVar9 = false;
              in_R9 = local_1c0;
              pdVar8 = pdVar7;
              do {
                lVar13 = 0x18;
                lVar15 = 0;
                while( true ) {
                  if (lVar15 == 3) goto LAB_0035ea0a;
                  dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
                  lVar15 = lVar15 + 1;
                  pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
                  if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
                  pdVar14 = (double *)((long)pdVar8 + lVar13);
                  pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
                  lVar13 = lVar13 + 0x10;
                  if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
                }
                if (lVar15 < 4) break;
LAB_0035ea0a:
                lVar10 = lVar10 + 1;
                bVar9 = 3 < lVar10;
                if (lVar10 == 4) break;
                if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
                   (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
                break;
                pdVar8 = pdVar8 + 8;
                in_R9 = in_R9 + 2;
                if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
                   (NAN(pdVar7[lVar10 * 8 + 1]) ||
                    NAN((double)local_1c0[lVar10 * 2]._M_string_length))) break;
              } while( true );
            }
          }
        }
        else {
          bVar9 = false;
        }
        local_250[0] = (internal)bVar9;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot10.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x9e,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<double>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot10.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xa2,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[1], q[0];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[1], q[0];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xa3,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 5;
        local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).qubit_ = 3;
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051fe50;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xa9,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
        local_228._0_4_ = 5;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.control()","5",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xac,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar5 = (*(((QGate1<std::complex<double>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar5;
        local_228._0_4_ = 3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.target()","3",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xad,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xae,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pdVar7 = (double *)operator_new__(0x100);
        memset(pdVar7,0,0x100);
        *pdVar7 = 1.0;
        pdVar7[1] = 0.0;
        pdVar7[2] = 0.0;
        pdVar7[3] = 0.0;
        pdVar7[4] = 0.0;
        pdVar7[5] = 0.0;
        pdVar7[6] = 0.0;
        pdVar7[7] = 0.0;
        pdVar7[8] = 0.0;
        pdVar7[9] = 0.0;
        pdVar7[10] = 0.0;
        pdVar7[0xb] = 0.0;
        pdVar7[0xc] = 0.0;
        pdVar7[0xd] = 0.0;
        pdVar7[0xe] = 1.0;
        pdVar7[0xf] = 0.0;
        pdVar7[0x10] = 0.0;
        pdVar7[0x11] = 0.0;
        pdVar7[0x12] = 0.0;
        pdVar7[0x13] = 0.0;
        pdVar7[0x14] = 1.0;
        pdVar7[0x15] = 0.0;
        pdVar7[0x16] = 0.0;
        pdVar7[0x17] = 0.0;
        pdVar7[0x18] = 0.0;
        pdVar7[0x19] = 0.0;
        pdVar7[0x1a] = 1.0;
        pdVar7[0x1f] = 0.0;
        pdVar7[0x1d] = 0.0;
        pdVar7[0x1e] = 0.0;
        pdVar7[0x1b] = 0.0;
        pdVar7[0x1c] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
                  ((QControlledGate2<std::complex<double>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar9 = false;
          if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
            if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
               (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
              lVar10 = 0;
              bVar9 = false;
              in_R9 = local_1c0;
              pdVar8 = pdVar7;
              do {
                lVar13 = 0x18;
                lVar15 = 0;
                while( true ) {
                  if (lVar15 == 3) goto LAB_0035f1a6;
                  dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
                  lVar15 = lVar15 + 1;
                  pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
                  if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
                  pdVar14 = (double *)((long)pdVar8 + lVar13);
                  pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
                  lVar13 = lVar13 + 0x10;
                  if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
                }
                if (lVar15 < 4) break;
LAB_0035f1a6:
                lVar10 = lVar10 + 1;
                bVar9 = 3 < lVar10;
                if (lVar10 == 4) break;
                if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
                   (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
                break;
                pdVar8 = pdVar8 + 8;
                in_R9 = in_R9 + 2;
                if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
                   (NAN(pdVar7[lVar10 * 8 + 1]) ||
                    NAN((double)local_1c0[lVar10 * 2]._M_string_length))) break;
              } while( true );
            }
          }
        }
        else {
          bVar9 = false;
        }
        local_250[0] = (internal)bVar9;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot53.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xb5,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<double>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot53.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xb9,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[5], q[3];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[5], q[3];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xba,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 0;
        local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 0;
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).qubit_ = 1;
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051fe50;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xc4,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.control()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,199,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar5 = (*(((QGate1<std::complex<double>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar5;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.target()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,200,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.controlState()","0",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xc9,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pdVar7 = (double *)operator_new__(0x100);
        memset(pdVar7,0,0x100);
        pdVar7[2] = 1.0;
        pdVar7[3] = 0.0;
        pdVar7[4] = 0.0;
        pdVar7[5] = 0.0;
        pdVar7[6] = 0.0;
        pdVar7[7] = 0.0;
        pdVar7[8] = 1.0;
        pdVar7[9] = 0.0;
        pdVar7[10] = 0.0;
        pdVar7[0xb] = 0.0;
        pdVar7[0xc] = 0.0;
        pdVar7[0xd] = 0.0;
        pdVar7[0xe] = 0.0;
        pdVar7[0xf] = 0.0;
        pdVar7[0x10] = 0.0;
        pdVar7[0x11] = 0.0;
        pdVar7[0x12] = 0.0;
        pdVar7[0x13] = 0.0;
        pdVar7[0x14] = 1.0;
        pdVar7[0x15] = 0.0;
        pdVar7[0x16] = 0.0;
        pdVar7[0x17] = 0.0;
        pdVar7[0x18] = 0.0;
        pdVar7[0x19] = 0.0;
        pdVar7[0x1a] = 0.0;
        pdVar7[0x1b] = 0.0;
        pdVar7[0x1c] = 0.0;
        pdVar7[0x1d] = 0.0;
        pdVar7[0x1e] = 1.0;
        pdVar7[0x1f] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
                  ((QControlledGate2<std::complex<double>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar9 = false;
          if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
            if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
               (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
              lVar10 = 0;
              bVar9 = false;
              in_R9 = local_1c0;
              pdVar8 = pdVar7;
              do {
                lVar13 = 0x18;
                lVar15 = 0;
                while( true ) {
                  if (lVar15 == 3) goto LAB_0035f937;
                  dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
                  lVar15 = lVar15 + 1;
                  pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
                  if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
                  pdVar14 = (double *)((long)pdVar8 + lVar13);
                  pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
                  lVar13 = lVar13 + 0x10;
                  if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
                }
                if (lVar15 < 4) break;
LAB_0035f937:
                lVar10 = lVar10 + 1;
                bVar9 = 3 < lVar10;
                if (lVar10 == 4) break;
                if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
                   (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
                break;
                pdVar8 = pdVar8 + 8;
                in_R9 = in_R9 + 2;
                if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
                   (NAN(pdVar7[lVar10 * 8 + 1]) ||
                    NAN((double)local_1c0[lVar10 * 2]._M_string_length))) break;
              } while( true );
            }
          }
        }
        else {
          bVar9 = false;
        }
        local_250[0] = (internal)bVar9;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot01.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xd0,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<double>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot01.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xd4,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
                  ((internal *)local_228,"qasm.str()","\"x q[0];\\ncx q[0], q[1];\\nx q[0];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [32])"x q[0];\ncx q[0], q[1];\nx q[0];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xd5,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<double>_>.control_ = 1;
        local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_ = 0;
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).qubit_ = 0;
        (((PauliX<std::complex<double>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051fe50;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xdb,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.control_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.control()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xde,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar5 = (*(((QGate1<std::complex<double>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar5;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.target()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xdf,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<double>_>.controlState_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.controlState()","0",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xe0,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pdVar7 = (double *)operator_new__(0x100);
        memset(pdVar7,0,0x100);
        pdVar7[4] = 1.0;
        pdVar7[5] = 0.0;
        pdVar7[6] = 0.0;
        pdVar7[7] = 0.0;
        pdVar7[8] = 0.0;
        pdVar7[9] = 0.0;
        pdVar7[10] = 1.0;
        pdVar7[0xb] = 0.0;
        pdVar7[0xc] = 0.0;
        pdVar7[0xd] = 0.0;
        pdVar7[0xe] = 0.0;
        pdVar7[0xf] = 0.0;
        pdVar7[0x10] = 1.0;
        pdVar7[0x11] = 0.0;
        pdVar7[0x12] = 0.0;
        pdVar7[0x13] = 0.0;
        pdVar7[0x14] = 0.0;
        pdVar7[0x15] = 0.0;
        pdVar7[0x16] = 0.0;
        pdVar7[0x17] = 0.0;
        pdVar7[0x18] = 0.0;
        pdVar7[0x19] = 0.0;
        pdVar7[0x1a] = 0.0;
        pdVar7[0x1b] = 0.0;
        pdVar7[0x1c] = 0.0;
        pdVar7[0x1d] = 0.0;
        pdVar7[0x1e] = 1.0;
        pdVar7[0x1f] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
                  ((QControlledGate2<std::complex<double>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar9 = false;
          if ((*pdVar7 == (double)(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pdVar7) && !NAN((double)(local_1c0->_M_dataplus)._M_p))) {
            if ((pdVar7[1] == (double)local_1c0->_M_string_length) &&
               (!NAN(pdVar7[1]) && !NAN((double)local_1c0->_M_string_length))) {
              lVar10 = 0;
              bVar9 = false;
              in_R9 = local_1c0;
              pdVar8 = pdVar7;
              do {
                lVar13 = 0x18;
                lVar15 = 0;
                while( true ) {
                  if (lVar15 == 3) goto LAB_003600c2;
                  dVar3 = *(double *)((long)pdVar8 + lVar13 + -8);
                  lVar15 = lVar15 + 1;
                  pdVar14 = (double *)((long)in_R9 + lVar13 + -8);
                  if ((dVar3 != *pdVar14) || (NAN(dVar3) || NAN(*pdVar14))) break;
                  pdVar14 = (double *)((long)pdVar8 + lVar13);
                  pdVar2 = (double *)((long)&(in_R9->_M_dataplus)._M_p + lVar13);
                  lVar13 = lVar13 + 0x10;
                  if ((*pdVar14 != *pdVar2) || (NAN(*pdVar14) || NAN(*pdVar2))) break;
                }
                if (lVar15 < 4) break;
LAB_003600c2:
                lVar10 = lVar10 + 1;
                bVar9 = 3 < lVar10;
                if (lVar10 == 4) break;
                if ((pdVar7[lVar10 * 8] != (double)local_1c0[lVar10 * 2]._M_dataplus._M_p) ||
                   (NAN(pdVar7[lVar10 * 8]) || NAN((double)local_1c0[lVar10 * 2]._M_dataplus._M_p)))
                break;
                pdVar8 = pdVar8 + 8;
                in_R9 = in_R9 + 2;
                if ((pdVar7[lVar10 * 8 + 1] != (double)local_1c0[lVar10 * 2]._M_string_length) ||
                   (NAN(pdVar7[lVar10 * 8 + 1]) ||
                    NAN((double)local_1c0[lVar10 * 2]._M_string_length))) break;
              } while( true );
            }
          }
        }
        else {
          bVar9 = false;
        }
        local_250[0] = (internal)bVar9;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot10.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xe7,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<double>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot10.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xeb,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
                  ((internal *)local_228,"qasm.str()","\"x q[1];\\ncx q[1], q[0];\\nx q[1];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [32])"x q[1];\ncx q[1], q[0];\nx q[1];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xec,pcVar11);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pdVar7);
        local_1e8.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if ((_Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>)
            local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (_Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>)0x0) {
          (*(((QGate1<std::complex<double>_> *)
             local_1e8.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[0xd])();
        }
        return;
      }
    }
  }
  __assert_fail("this->control() != target",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CX.hpp"
                ,0x81,
                "virtual void qclab::qgates::CX<std::complex<double>>::setTarget(const int) [T = std::complex<double>]"
               );
}

Assistant:

void test_qclab_qgates_CNOT() {

  //
  // CNOTs |1> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot ;

    EXPECT_EQ( cnot.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot.controlled() ) ;      // controlled
    EXPECT_EQ( cnot.control() , 0 ) ;       // control
    EXPECT_EQ( cnot.target() , 1 ) ;        // target
    EXPECT_EQ( cnot.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot.matrix() == CNOT_check ) ;

    // qubit
    EXPECT_EQ( cnot.qubit() , 0 ) ;

    // qubits
    auto qubits = cnot.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 5 , 3 } ;
    cnot.setQubits( &qnew[0] ) ;
    EXPECT_EQ( cnot.qubits()[0] , 3 ) ;
    EXPECT_EQ( cnot.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    cnot.setQubits( &qnew[0] ) ;

    // print
    cnot.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // gate
    qclab::qgates::PauliX< T >  X ;
    EXPECT_TRUE( *cnot.gate() == X ) ;
    EXPECT_TRUE( cnot.gate()->matrix() == X.matrix() ) ;

    // operators == and !=
    EXPECT_TRUE(  cnot != X ) ;
    EXPECT_FALSE( cnot == X ) ;
    qclab::qgates::CNOT< T >  cnot2 ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    // setControl, setTarget, setControlState
    cnot.setControl( 3 ) ;
    EXPECT_EQ( cnot.control() , 3 ) ;
    cnot.setTarget( 5 ) ;
    EXPECT_EQ( cnot.target() , 5 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 4 ) ;
    EXPECT_EQ( cnot.control() , 4 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;

    qubits[0] = 1 ;
    qubits[1] = 2 ;
    cnot.setQubits( &qubits[0] ) ;
    EXPECT_EQ( cnot.control() , 1 ) ;
    EXPECT_EQ( cnot.target() , 2 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 0 ) ;
    EXPECT_EQ( cnot.control() , 0 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    cnot.setControlState( 0 ) ;
    EXPECT_EQ( cnot.controlState() , 0 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot35( 3 , 5 ) ;

    EXPECT_EQ( cnot35.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot35.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot35.controlled() ) ;      // controlled
    EXPECT_EQ( cnot35.control() , 3 ) ;       // control
    EXPECT_EQ( cnot35.target() , 5 ) ;        // target
    EXPECT_EQ( cnot35.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot35.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot35.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[3], q[5];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[1], q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot53( 5 , 3 ) ;

    EXPECT_EQ( cnot53.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot53.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot53.controlled() ) ;      // controlled
    EXPECT_EQ( cnot53.control() , 5 ) ;       // control
    EXPECT_EQ( cnot53.target() , 3 ) ;        // target
    EXPECT_EQ( cnot53.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot53.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot53.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[5], q[3];\n" ) ;
  }


  //
  // CNOTs |0> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 , 0 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\ncx q[0], q[1];\nx q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[1];\ncx q[1], q[0];\nx q[1];\n" ) ;
  }

}